

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint * create_is_true_constraint(void)

{
  CgreenValue expected_value;
  Constraint *pCVar1;
  Constraint *constraint;
  undefined8 in_stack_ffffffffffffffe0;
  anon_union_8_4_d526cc82_for_value in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  
  make_cgreen_integer_value((CgreenValue *)&stack0xffffffffffffffe0,0);
  expected_value.value.integer_value = in_stack_ffffffffffffffe8.integer_value;
  expected_value.type = (CgreenValueType)in_stack_ffffffffffffffe0;
  expected_value._4_4_ = SUB84(in_stack_ffffffffffffffe0,4);
  expected_value.value_size = in_stack_fffffffffffffff0;
  pCVar1 = create_constraint_expecting(expected_value,in_stack_ffffffffffffffe8.string_value);
  pCVar1->type = CGREEN_VALUE_COMPARER_CONSTRAINT;
  pCVar1->name = "be true";
  pCVar1->compare = compare_do_not_want_value;
  pCVar1->execute = test_want;
  pCVar1->actual_value_message = "";
  pCVar1->expected_value_message = "";
  return pCVar1;
}

Assistant:

Constraint *create_is_true_constraint(void) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_integer_value(false), "true");
    constraint->type = CGREEN_VALUE_COMPARER_CONSTRAINT;

    constraint->name = "be true";
    constraint->compare = &compare_do_not_want_value;
    constraint->execute = &test_want;
    constraint->actual_value_message = "";
    constraint->expected_value_message = "";

    return constraint;
}